

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_GetDerefedNodes(Acb_Ntk_t *p)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  char *pStr;
  int NameId;
  char *pName;
  int iObj;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vNodes;
  Vec_Ptr_t *vNames;
  Acb_Ntk_t *p_local;
  
  p_00 = Abc_FrameReadSignalNames();
  if (p_00 == (Vec_Ptr_t *)0x0) {
    p_local = (Acb_Ntk_t *)0x0;
  }
  else {
    p_local = (Acb_Ntk_t *)Vec_IntAlloc(100);
    iVar1 = Abc_NamObjNumMax(p->pDesign->pStrs);
    p_01 = Vec_IntStartFull(iVar1);
    for (pName._0_4_ = 1; iVar1 = Vec_StrSize(&p->vObjType), (int)pName < iVar1;
        pName._0_4_ = (int)pName + 1) {
      AVar2 = Acb_ObjType(p,(int)pName);
      if ((AVar2 != ABC_OPER_NONE) && (iVar1 = Acb_ObjName(p,(int)pName), iVar1 != 0)) {
        iVar1 = Acb_ObjName(p,(int)pName);
        Vec_IntWriteEntry(p_01,iVar1,(int)pName);
      }
    }
    for (pName._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), pName._4_4_ < iVar1;
        pName._4_4_ = pName._4_4_ + 1) {
      pStr = (char *)Vec_PtrEntry(p_00,pName._4_4_);
      iVar1 = Abc_NamStrFindOrAdd(p->pDesign->pStrs,pStr,(int *)0x0);
      if (iVar1 == 0) {
        printf("Cannot find name ID for name %s\n",pStr);
        Vec_IntFree(p_01);
        Vec_IntFree((Vec_Int_t *)p_local);
        return (Vec_Int_t *)0x0;
      }
      iVar3 = Vec_IntEntry(p_01,iVar1);
      if (iVar3 == -1) {
        printf("Cannot find obj ID for name %s\n",pStr);
        Vec_IntFree(p_01);
        Vec_IntFree((Vec_Int_t *)p_local);
        return (Vec_Int_t *)0x0;
      }
      iVar1 = Vec_IntEntry(p_01,iVar1);
      Vec_IntPush((Vec_Int_t *)p_local,iVar1);
    }
    Vec_IntFree(p_01);
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Acb_GetDerefedNodes( Acb_Ntk_t * p )
{
    Vec_Ptr_t * vNames = Abc_FrameReadSignalNames();
    if ( vNames != NULL )
    {
        Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
        Vec_Int_t * vMap   = Vec_IntStartFull( Abc_NamObjNumMax(p->pDesign->pStrs) );
        int i, iObj; char * pName;
        Acb_NtkForEachObj( p, iObj )
            if ( Acb_ObjName(p, iObj) )
                Vec_IntWriteEntry( vMap, Acb_ObjName(p, iObj), iObj );
        Vec_PtrForEachEntry( char *, vNames, pName, i )
        {
            int NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, pName, NULL );
            if ( NameId == 0 )
            {
                printf( "Cannot find name ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else if ( Vec_IntEntry(vMap, NameId) == -1 )
            {
                printf( "Cannot find obj ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else
                Vec_IntPush( vNodes, Vec_IntEntry(vMap, NameId) );
        }
        Vec_IntFree( vMap );
        return vNodes;
    }
    return NULL;
}